

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfig.cpp
# Opt level: O3

void __thiscall
SoundConfig::readSettings(SoundConfig *this,QSettings *settings,AudioEnumerator *enumerator)

{
  int *piVar1;
  undefined8 uVar2;
  QDebug QVar3;
  int iVar4;
  qsizetype qVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QString api;
  QVariant deviceId;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  char *local_90;
  anon_union_24_3_e3d07ef4_for_data local_88;
  QDebug local_68;
  QArrayData *local_60;
  undefined8 *local_58;
  long local_50;
  anon_union_24_3_e3d07ef4_for_data local_48;
  char *local_30;
  
  QSettings::beginGroup((QString *)settings);
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_4_ = 0;
  local_a8._20_4_ = 0;
  local_90 = (char *)0x2;
  QSettings::value((QString *)&local_48,(QVariant *)settings);
  QVariant::toString();
  QVariant::~QVariant((QVariant *)&local_48);
  QVariant::~QVariant((QVariant *)&local_a8);
  if (local_50 == 0) {
LAB_00143ff2:
    iVar4 = 0;
LAB_00143ff5:
    this->mBackendIndex = iVar4;
  }
  else {
    AudioEnumerator::backendNames(enumerator);
    local_a8._0_4_ = (undefined4)local_50;
    local_a8._4_4_ = (undefined4)((ulong)local_50 >> 0x20);
    local_a8._8_4_ = SUB84(local_58,0);
    local_a8._12_4_ = (undefined4)((ulong)local_58 >> 0x20);
    qVar5 = QtPrivate::indexOf<QString,QStringView>
                      ((QList<QString> *)&local_48,(QStringView *)&local_a8,0);
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_48);
    iVar4 = (int)qVar5;
    if (iVar4 == -1) {
      local_48._0_4_ = 2;
      local_48._4_8_ = 0;
      local_48._12_8_ = 0;
      local_48._20_4_ = 0;
      local_30 = "default";
      QMessageLogger::warning();
      uVar2 = local_88.shared;
      *(QTextStream *)(local_88.shared + 0x31) = (QTextStream)0x1;
      QVar6.m_data = (storage_type *)0xd;
      QVar6.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar6);
      QTextStream::operator<<((QTextStream *)uVar2,(QString *)&local_a8);
      piVar1 = (int *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_),2,8);
        }
      }
      if ((char)(((QArrayData *)(local_88.shared + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_88.shared,' ');
      }
      uVar2 = local_88.shared;
      QVar7.m_data = (storage_type *)0x9;
      QVar7.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar7);
      QTextStream::operator<<((QTextStream *)uVar2,(QString *)&local_a8);
      piVar1 = (int *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_),2,8);
        }
      }
      if ((char)(((QArrayData *)(local_88.shared + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_88.shared,' ');
      }
      if (local_58 == (undefined8 *)0x0) {
        local_58 = &QString::_empty;
      }
      QDebug::putString((QChar *)&local_88,(ulong)local_58);
      if ((char)(((QArrayData *)(local_88.shared + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_88.shared,' ');
      }
      uVar2 = local_88.shared;
      QVar8.m_data = (storage_type *)0xd;
      QVar8.m_size = (qsizetype)&local_a8;
      QString::fromUtf8(QVar8);
      QTextStream::operator<<((QTextStream *)uVar2,(QString *)&local_a8);
      piVar1 = (int *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_a8._4_4_,local_a8._0_4_),2,8);
        }
      }
      if ((char)(((QArrayData *)(local_88.shared + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_88.shared,' ');
      }
      QDebug::~QDebug((QDebug *)&local_88.shared);
      goto LAB_00143ff2;
    }
    if (-2 < iVar4) goto LAB_00143ff5;
  }
  AudioEnumerator::populate(enumerator,iVar4);
  local_a8._0_4_ = 0;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_4_ = 0;
  local_a8._20_4_ = 0;
  local_90 = (char *)0x2;
  QSettings::value((QString *)&local_48,(QVariant *)settings);
  QVariant::~QVariant((QVariant *)&local_a8);
  iVar4 = AudioEnumerator::deserializeDevice(enumerator,iVar4,(QVariant *)&local_48);
  if (iVar4 == -1) {
    local_a8._0_4_ = 2;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    local_a8._16_4_ = 0;
    local_a8._20_4_ = 0;
    local_90 = "default";
    QMessageLogger::warning();
    QVar3.stream = local_68.stream;
    QVar9.m_data = (storage_type *)0xd;
    QVar9.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_88);
    if ((QArrayData *)local_88.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_88.shared = *(int *)local_88.shared + -1;
      UNLOCK();
      if (*(int *)local_88.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_88.shared,2,8);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QVar3.stream = local_68.stream;
    QVar10.m_data = (storage_type *)0x33;
    QVar10.m_size = (qsizetype)&local_88;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar3.stream,(QString *)&local_88);
    if ((QArrayData *)local_88.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_88.shared = *(int *)local_88.shared + -1;
      UNLOCK();
      if (*(int *)local_88.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_88.shared,2,8);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    QDebug::~QDebug(&local_68);
    iVar4 = 0;
  }
  else if (iVar4 < -1) goto LAB_00144158;
  this->mDeviceIndex = iVar4;
LAB_00144158:
  iVar4 = StandardRates::get((long)this->mSamplerateIndex);
  QVariant::QVariant((QVariant *)&local_88,iVar4);
  QSettings::value((QString *)&local_a8,(QVariant *)settings);
  iVar4 = QVariant::toInt((bool *)local_a8.data);
  setSamplerate(this,iVar4);
  QVariant::~QVariant((QVariant *)&local_a8);
  QVariant::~QVariant((QVariant *)&local_88);
  QVariant::QVariant((QVariant *)&local_88,this->mLatency);
  QSettings::value((QString *)&local_a8,(QVariant *)settings);
  iVar4 = QVariant::toInt((bool *)local_a8.data);
  setLatency(this,iVar4);
  QVariant::~QVariant((QVariant *)&local_a8);
  QVariant::~QVariant((QVariant *)&local_88);
  QVariant::QVariant((QVariant *)&local_88,this->mPeriod);
  QSettings::value((QString *)&local_a8,(QVariant *)settings);
  iVar4 = QVariant::toInt((bool *)local_a8.data);
  setPeriod(this,iVar4);
  QVariant::~QVariant((QVariant *)&local_a8);
  QVariant::~QVariant((QVariant *)&local_88);
  QSettings::endGroup();
  QVariant::~QVariant((QVariant *)&local_48);
  if (local_60 != (QArrayData *)0x0) {
    LOCK();
    (local_60->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_60->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_60,2,8);
    }
  }
  return;
}

Assistant:

void SoundConfig::readSettings(QSettings &settings, AudioEnumerator &enumerator) {
    settings.beginGroup(Keys::Sound);

    //
    // Sound configuration notes:
    // If the API cannot be found the first one available is chosen
    // If the device name cannot be found, the default one is chosen
    //

    QString api = settings.value(Keys::api).toString();
    int backend;
    if (api.isEmpty()) {
        backend = 0; // default to first available
    } else {
        backend = enumerator.backendNames().indexOf(api);
        if (backend == -1) {
            qWarning().noquote() << TU::LOG_PREFIX << "audio API" << api << "not available";
            backend = 0; // default to the first one
        }
    }

    setBackendIndex(backend);
    enumerator.populate(backend);

    auto deviceId = settings.value(Keys::deviceId);
    int device = enumerator.deserializeDevice(backend, deviceId);
    if (device == -1) {
        qWarning() << TU::LOG_PREFIX << "last configured device not available, using default";
        device = 0;
    }
    setDeviceIndex(device);

    setSamplerate(settings.value(Keys::samplerate, samplerate()).toInt());
    setLatency(settings.value(Keys::latency, mLatency).toInt());
    setPeriod(settings.value(Keys::period, mPeriod).toInt());

    settings.endGroup();
}